

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O0

SVGLinearGradientAttributes * __thiscall
lunasvg::SVGLinearGradientElement::collectGradientAttributes
          (SVGLinearGradientAttributes *__return_storage_ptr__,SVGLinearGradientElement *this)

{
  SVGGradientElement *pSVar1;
  ElementID EVar2;
  bool bVar3;
  Document *document;
  SVGLinearGradientElement *pSVar4;
  size_type sVar5;
  SVGElement *targetElement;
  SVGLinearGradientElement *element;
  SVGLinearGradientElement *local_48;
  SVGGradientElement *current;
  set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  processedGradients;
  SVGLinearGradientElement *this_local;
  
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  SVGLinearGradientAttributes::SVGLinearGradientAttributes(__return_storage_ptr__);
  std::
  set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  ::set((set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
         *)&current);
  local_48 = this;
  do {
    SVGGradientElement::collectGradientAttributes
              (&local_48->super_SVGGradientElement,
               &__return_storage_ptr__->super_SVGGradientAttributes);
    EVar2 = SVGElement::id((SVGElement *)local_48);
    pSVar4 = local_48;
    if (EVar2 == LinearGradient) {
      bVar3 = SVGLinearGradientAttributes::hasX1(__return_storage_ptr__);
      if ((!bVar3) && (bVar3 = SVGElement::hasAttribute((SVGElement *)pSVar4,X1), bVar3)) {
        SVGLinearGradientAttributes::setX1(__return_storage_ptr__,pSVar4);
      }
      bVar3 = SVGLinearGradientAttributes::hasY1(__return_storage_ptr__);
      if ((!bVar3) && (bVar3 = SVGElement::hasAttribute((SVGElement *)pSVar4,Y1), bVar3)) {
        SVGLinearGradientAttributes::setY1(__return_storage_ptr__,pSVar4);
      }
      bVar3 = SVGLinearGradientAttributes::hasX2(__return_storage_ptr__);
      if ((!bVar3) && (bVar3 = SVGElement::hasAttribute((SVGElement *)pSVar4,X2), bVar3)) {
        SVGLinearGradientAttributes::setX2(__return_storage_ptr__,pSVar4);
      }
      bVar3 = SVGLinearGradientAttributes::hasY2(__return_storage_ptr__);
      if ((!bVar3) && (bVar3 = SVGElement::hasAttribute((SVGElement *)pSVar4,Y2), bVar3)) {
        SVGLinearGradientAttributes::setY2(__return_storage_ptr__,pSVar4);
      }
    }
    pSVar1 = &local_48->super_SVGGradientElement;
    document = SVGNode::document((SVGNode *)this);
    pSVar4 = (SVGLinearGradientElement *)
             SVGURIReference::getTargetElement(&pSVar1->super_SVGURIReference,document);
    if ((pSVar4 == (SVGLinearGradientElement *)0x0) ||
       ((EVar2 = SVGElement::id((SVGElement *)pSVar4), EVar2 != LinearGradient &&
        (EVar2 = SVGElement::id((SVGElement *)pSVar4), EVar2 != RadialGradient)))) break;
    std::
    set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
    ::insert((set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
              *)&current,(value_type *)&local_48);
    local_48 = pSVar4;
    sVar5 = std::
            set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
            ::count((set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
                     *)&current,(key_type *)&local_48);
  } while (sVar5 == 0);
  SVGLinearGradientAttributes::setDefaultValues(__return_storage_ptr__,this);
  std::
  set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  ::~set((set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
          *)&current);
  return __return_storage_ptr__;
}

Assistant:

SVGLinearGradientAttributes SVGLinearGradientElement::collectGradientAttributes() const
{
    SVGLinearGradientAttributes attributes;
    std::set<const SVGGradientElement*> processedGradients;
    const SVGGradientElement* current = this;
    while(true) {
        current->collectGradientAttributes(attributes);
        if(current->id() == ElementID::LinearGradient) {
            auto element = static_cast<const SVGLinearGradientElement*>(current);
            if(!attributes.hasX1() && element->hasAttribute(PropertyID::X1))
                attributes.setX1(element);
            if(!attributes.hasY1() && element->hasAttribute(PropertyID::Y1))
                attributes.setY1(element);
            if(!attributes.hasX2() && element->hasAttribute(PropertyID::X2))
                attributes.setX2(element);
            if(!attributes.hasY2() && element->hasAttribute(PropertyID::Y2)) {
                attributes.setY2(element);
            }
        }

        auto targetElement = current->getTargetElement(document());
        if(!targetElement || !(targetElement->id() == ElementID::LinearGradient || targetElement->id() == ElementID::RadialGradient))
            break;
        processedGradients.insert(current);
        current = static_cast<const SVGGradientElement*>(targetElement);
        if(processedGradients.count(current) > 0) {
            break;
        }
    }

    attributes.setDefaultValues(this);
    return attributes;
}